

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O2

Node * __thiscall
YAML::Node::operator[]<std::__cxx11::string>
          (Node *__return_storage_ptr__,Node *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  node *pnVar1;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  EnsureNodeExists(this);
  pnVar1 = this->m_pNode;
  std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_68,
             &(this->m_pMemory).
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>);
  pnVar1 = detail::node::get<std::__cxx11::string>(pnVar1,key,(shared_memory_holder *)&_Stack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
  if (pnVar1 == (node *)0x0) {
    streamable_to_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ::impl(&local_48,key);
    Node(__return_storage_ptr__,ZombieNode,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &(this->m_pMemory).
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>);
    Node(__return_storage_ptr__,pnVar1,(shared_memory_holder *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

inline const Node Node::operator[](const Key& key) const {
  EnsureNodeExists();
  detail::node* value =
      static_cast<const detail::node&>(*m_pNode).get(key, m_pMemory);
  if (!value) {
    return Node(ZombieNode, key_to_string(key));
  }
  return Node(*value, m_pMemory);
}